

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void process_reserved_name(char *s,char *prefix,uint32_t *max_num)

{
  int iVar1;
  char *in_RAX;
  size_t __n;
  ulong uVar2;
  char *end;
  char *local_28;
  
  local_28 = in_RAX;
  __n = strlen(prefix);
  iVar1 = strncmp(s,prefix,__n);
  if (iVar1 == 0) {
    uVar2 = strtoul(s + __n,&local_28,10);
    if ((*local_28 == '\0') && (*max_num < (uint)uVar2)) {
      *max_num = (uint)uVar2;
    }
  }
  return;
}

Assistant:

static void process_reserved_name (const char *s, const char *prefix, uint32_t *max_num) {
  char *end;
  uint32_t num;
  size_t len = strlen (prefix);

  if (strncmp (s, prefix, len) != 0) return;
  num = strtoul (s + len, &end, 10);
  if (*end != '\0') return;
  if (*max_num < num) *max_num = num;
}